

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

HTTPAPIEX_HANDLE HTTPAPIEX_Create(char *hostName)

{
  LOGGER_LOG p_Var1;
  STRING_HANDLE pSVar2;
  VECTOR_HANDLE pVVar3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  HTTPAPIEX_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  HTTPAPIEX_HANDLE result;
  char *hostName_local;
  
  if (hostName == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                ,"HTTPAPIEX_Create",0x4f,1,"invalid (NULL) parameter");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)calloc(1,0x20);
    if (l == (LOGGER_LOG)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                  ,"HTTPAPIEX_Create",0x58,1,"malloc failed.");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      pSVar2 = STRING_construct(hostName);
      *(STRING_HANDLE *)l = pSVar2;
      if (*(long *)l == 0) {
        free(l);
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                    ,"HTTPAPIEX_Create",0x62,1,"unable to STRING_construct");
        }
        l = (LOGGER_LOG)0x0;
      }
      else {
        pVVar3 = VECTOR_create(0x10);
        *(VECTOR_HANDLE *)(l + 0x18) = pVVar3;
        if (*(long *)(l + 0x18) == 0) {
          STRING_delete(*(STRING_HANDLE *)l);
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          *(undefined4 *)(l + 8) = 0xffffffff;
          *(long *)(l + 0x10) = 0;
        }
      }
    }
  }
  return (HTTPAPIEX_HANDLE)l;
}

Assistant:

HTTPAPIEX_HANDLE HTTPAPIEX_Create(const char* hostName)
{
    HTTPAPIEX_HANDLE result;
    /*Codes_SRS_HTTPAPIEX_02_001: [If parameter hostName is NULL then HTTPAPIEX_Create shall return NULL.]*/
    if (hostName == NULL)
    {
        LogError("invalid (NULL) parameter");
        result = NULL;
    }
    else
    {
        /*Codes_SRS_HTTPAPIEX_02_005: [If creating the handle fails for any reason, then HTTAPIEX_Create shall return NULL.] */
        HTTPAPIEX_HANDLE_DATA* handleData = (HTTPAPIEX_HANDLE_DATA*)calloc(1, sizeof(HTTPAPIEX_HANDLE_DATA));
        if (handleData == NULL)
        {
            LogError("malloc failed.");
            result = NULL;
        }
        else
        {
            /*Codes_SRS_HTTPAPIEX_02_002: [Parameter hostName shall be saved.]*/
            handleData->hostName = STRING_construct(hostName);
            if (handleData->hostName == NULL)
            {
                free(handleData);
                LogError("unable to STRING_construct");
                result = NULL;
            }
            else
            {
                /*Codes_SRS_HTTPAPIEX_02_004: [Otherwise, HTTPAPIEX_Create shall return a HTTAPIEX_HANDLE suitable for further calls to the module.] */
                handleData->savedOptions = VECTOR_create(sizeof(HTTPAPIEX_SAVED_OPTION));
                if (handleData->savedOptions == NULL)
                {
                    STRING_delete(handleData->hostName);
                    free(handleData);
                    result = NULL;
                }
                else
                {
                    handleData->k = -1;
                    handleData->httpHandle = NULL;
                    result = handleData;
                }
            }
        }
    }
    return result;
}